

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O0

void analysePdlpSolution(HighsOptions *options,HighsLp *lp,HighsSolution *highs_solution)

{
  int iVar1;
  const_reference pvVar2;
  double *pdVar3;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  double complementary_violation;
  double dual_residual;
  double primal_residual;
  double mid;
  double upper_1;
  double lower_1;
  double dual_1;
  double primal;
  HighsInt iRow_2;
  bool is_col;
  HighsInt iVar;
  double max_complementary_violation;
  HighsInt iRow_1;
  HighsInt iCol_1;
  anon_class_96_12_0262ff65 updateInfeasibilities;
  double dual;
  double value;
  double upper;
  double lower;
  double dual_feasibility_tolerance;
  double primal_feasibility_tolerance;
  double sum_dual_infeasibility;
  double sum_primal_infeasibility;
  double max_dual_infeasibility;
  double max_primal_infeasibility;
  HighsInt num_dual_infeasibility;
  HighsInt num_primal_infeasibility;
  HighsInt iRow;
  HighsInt iCol;
  uint local_18c;
  char *local_180;
  double local_178;
  double local_170;
  value_type local_168;
  value_type local_160;
  value_type local_158;
  uint in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  value_type local_110;
  value_type local_108;
  value_type local_100;
  uint local_f4;
  byte local_ed;
  uint local_ec;
  double local_e8;
  int local_e0;
  int local_dc;
  value_type *local_d8;
  value_type *local_d0;
  undefined8 *local_c8;
  value_type *local_c0;
  double *local_b8;
  uint *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 *local_98;
  uint *local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  double local_78;
  value_type local_70;
  value_type local_68;
  value_type local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  int *local_10;
  long local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_1c = 0; (int)local_1c < *local_10; local_1c = local_1c + 1) {
    in_stack_fffffffffffffec4 = local_1c;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                        (long)(int)local_1c);
    printf("x[%2d] = %11.5g\n",*pvVar2,(ulong)in_stack_fffffffffffffec4);
  }
  for (local_20 = 0; (int)local_20 < local_10[1]; local_20 = local_20 + 1) {
    in_stack_fffffffffffffec0 = local_20;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),
                        (long)(int)local_20);
    printf("y[%2d] = %11.5g\n",*pvVar2,(ulong)in_stack_fffffffffffffec0);
  }
  local_24 = 0;
  local_28 = 0;
  local_30 = 0;
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = *(undefined8 *)(local_8 + 0x118);
  local_58 = *(undefined8 *)(local_8 + 0x120);
  local_d8 = &local_70;
  local_d0 = &local_60;
  local_c8 = &local_50;
  local_c0 = &local_68;
  local_b8 = &local_78;
  local_b0 = &local_24;
  local_a8 = &local_30;
  local_a0 = &local_40;
  local_98 = &local_58;
  local_90 = &local_28;
  local_88 = &local_38;
  local_80 = &local_48;
  for (local_dc = 0; local_dc < *local_10; local_dc = local_dc + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)local_dc);
    local_60 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)local_dc);
    local_68 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_dc);
    local_70 = *pvVar2;
    iVar1 = local_10[0x3c];
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),(long)local_dc)
    ;
    local_78 = (double)iVar1 * *pvVar2;
    analysePdlpSolution::anon_class_96_12_0262ff65::operator()
              ((anon_class_96_12_0262ff65 *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  for (local_e0 = 0; local_e0 < local_10[1]; local_e0 = local_e0 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),(long)local_e0)
    ;
    local_60 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),(long)local_e0)
    ;
    local_68 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),(long)local_e0)
    ;
    local_70 = *pvVar2;
    iVar1 = local_10[0x3c];
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),(long)local_e0)
    ;
    local_78 = (double)iVar1 * *pvVar2;
    analysePdlpSolution::anon_class_96_12_0262ff65::operator()
              ((anon_class_96_12_0262ff65 *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  local_e8 = 0.0;
  for (local_ec = 0; (int)local_ec < *local_10 + local_10[1]; local_ec = local_ec + 1) {
    local_ed = (int)local_ec < *local_10;
    local_f4 = local_ec - *local_10;
    if ((bool)local_ed) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                          (long)(int)local_ec);
      local_158 = *pvVar2;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                          (long)(int)local_f4);
      local_158 = *pvVar2;
    }
    local_100 = local_158;
    if ((local_ed & 1) == 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),
                          (long)(int)local_f4);
      local_160 = *pvVar2;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                          (long)(int)local_ec);
      local_160 = *pvVar2;
    }
    local_108 = local_160;
    if ((local_ed & 1) == 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                          (long)(int)local_f4);
      local_168 = *pvVar2;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                          (long)(int)local_ec);
      local_168 = *pvVar2;
    }
    local_110 = local_168;
    if ((local_ed & 1) == 0) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                          (long)(int)local_f4);
      local_170 = *pvVar2;
    }
    else {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                          (long)(int)local_ec);
      local_170 = *pvVar2;
    }
    local_118 = local_170;
    local_120 = (local_110 + local_170) * 0.5;
    if (local_100 < local_120) {
      local_170 = local_110;
    }
    local_178 = ABS(local_170 - local_100);
    local_128 = local_178;
    local_130 = ABS(local_108);
    local_138 = local_178 * local_130;
    pdVar3 = std::max<double>(&local_138,&local_e8);
    local_e8 = *pdVar3;
    if ((local_ed & 1) == 0) {
      local_180 = "Row   ";
    }
    else {
      local_180 = "Column";
    }
    if ((local_ed & 1) == 0) {
      local_18c = local_f4;
    }
    else {
      local_18c = local_ec;
    }
    printf("%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values (%11.6g, %11.6g) so complementary_violation = %11.6g\n"
           ,local_110,SUB84(local_100,0),local_118,local_128,local_130,local_138,local_180,
           (ulong)local_18c);
  }
  printf("PDLP max complementary violation = %g\n",local_e8);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",local_40,(int)local_30,(ulong)local_24
        );
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",local_48,(int)local_38,(ulong)local_28
        );
  return;
}

Assistant:

void analysePdlpSolution(const HighsOptions& options, const HighsLp& lp,
                         const HighsSolution& highs_solution) {
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
    printf("x[%2d] = %11.5g\n", int(iCol), highs_solution.col_value[iCol]);
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    printf("y[%2d] = %11.5g\n", int(iRow), highs_solution.row_dual[iRow]);
  }

  HighsInt num_primal_infeasibility = 0;
  HighsInt num_dual_infeasibility = 0;
  double max_primal_infeasibility = 0;
  double max_dual_infeasibility = 0;
  double sum_primal_infeasibility = 0;
  double sum_dual_infeasibility = 0;
  const double primal_feasibility_tolerance =
      options.primal_feasibility_tolerance;
  const double dual_feasibility_tolerance = options.dual_feasibility_tolerance;
  double lower;
  double upper;
  double value;
  double dual;
  // lambda for computing infeasibilities
  auto updateInfeasibilities = [&]() {
    double primal_infeasibility = 0;
    double dual_infeasibility = 0;
    // @primal_infeasibility calculation
    if (value < lower - primal_feasibility_tolerance) {
      // Below lower
      primal_infeasibility = lower - value;
    } else if (value > upper + primal_feasibility_tolerance) {
      // Above upper
      primal_infeasibility = value - upper;
    }
    double value_residual =
        std::min(std::fabs(lower - value), std::fabs(value - upper));
    bool at_a_bound = value_residual <= primal_feasibility_tolerance;
    if (at_a_bound) {
      // At a bound
      double middle = (lower + upper) * 0.5;
      if (lower < upper) {
        // Non-fixed variable
        if (value < middle) {
          // At lower
          dual_infeasibility = std::max(-dual, 0.);
        } else {
          // At upper
          dual_infeasibility = std::max(dual, 0.);
        }
      } else {
        // Fixed variable
        dual_infeasibility = 0;
      }
    } else {
      // Off bounds (or free)
      dual_infeasibility = fabs(dual);
    }
    // Accumulate primal infeasibilities
    if (primal_infeasibility > primal_feasibility_tolerance)
      num_primal_infeasibility++;
    max_primal_infeasibility =
        std::max(primal_infeasibility, max_primal_infeasibility);
    sum_primal_infeasibility += primal_infeasibility;
    // Accumulate dual infeasibilities
    if (dual_infeasibility > dual_feasibility_tolerance)
      num_dual_infeasibility++;
    max_dual_infeasibility =
        std::max(dual_infeasibility, max_dual_infeasibility);
    sum_dual_infeasibility += dual_infeasibility;
  };

  // Apply the model sense, as PDLP will have done this
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    lower = lp.col_lower_[iCol];
    upper = lp.col_upper_[iCol];
    value = highs_solution.col_value[iCol];
    dual = int(lp.sense_) * highs_solution.col_dual[iCol];
    updateInfeasibilities();
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    lower = lp.row_lower_[iRow];
    upper = lp.row_upper_[iRow];
    value = highs_solution.row_value[iRow];
    dual = int(lp.sense_) * highs_solution.row_dual[iRow];
    updateInfeasibilities();
  }
  //
  // Determine the sum of complementary violations
  double max_complementary_violation = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal = is_col ? highs_solution.col_value[iVar]
                                 : highs_solution.row_value[iRow];
    const double dual =
        is_col ? highs_solution.col_dual[iVar] : highs_solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    const double mid = (lower + upper) * 0.5;
    const double primal_residual =
        primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    const double dual_residual = std::fabs(dual);
    const double complementary_violation = primal_residual * dual_residual;
    max_complementary_violation =
        std::max(complementary_violation, max_complementary_violation);
    printf(
        "%s %2d [%11.5g, %11.5g, %11.5g] has (primal_residual, dual) values "
        "(%11.6g, %11.6g) so complementary_violation = %11.6g\n",
        is_col ? "Column" : "Row   ", is_col ? int(iVar) : int(iRow), lower,
        primal, upper, primal_residual, dual_residual, complementary_violation);
  }
  printf("PDLP max complementary violation = %g\n",
         max_complementary_violation);
  printf("     primal infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_primal_infeasibility), sum_primal_infeasibility,
         max_primal_infeasibility);
  printf("     dual   infeasibilities (%d, %11.6g, %11.6g)\n",
         int(num_dual_infeasibility), sum_dual_infeasibility,
         max_dual_infeasibility);
}